

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::calc_line_starts(Fl_Text_Display *this,int startLine,int endLine)

{
  int *piVar1;
  int *lineStarts;
  int nVis;
  int nextLineStart;
  int lineEnd;
  int line;
  int bufLen;
  int startPos;
  int endLine_local;
  int startLine_local;
  Fl_Text_Display *this_local;
  
  bufLen = endLine;
  startPos = startLine;
  _endLine_local = this;
  lineEnd = Fl_Text_Buffer::length(this->mBuffer);
  lineStarts._0_4_ = this->mNVisibleLines;
  piVar1 = this->mLineStarts;
  if (bufLen < 0) {
    bufLen = 0;
  }
  if ((int)lineStarts <= bufLen) {
    bufLen = (int)lineStarts + -1;
  }
  if (startPos < 0) {
    startPos = 0;
  }
  if ((int)lineStarts <= startPos) {
    startPos = (int)lineStarts + -1;
  }
  if (startPos <= bufLen) {
    if (startPos == 0) {
      *piVar1 = this->mFirstChar;
      startPos = 1;
    }
    line = piVar1[startPos + -1];
    if (line == -1) {
      for (nextLineStart = startPos; nextLineStart <= bufLen; nextLineStart = nextLineStart + 1) {
        piVar1[nextLineStart] = -1;
      }
    }
    else {
      for (nextLineStart = startPos; nextLineStart <= bufLen; nextLineStart = nextLineStart + 1) {
        find_line_end(this,line,true,&nVis,(int *)((long)&lineStarts + 4));
        line = lineStarts._4_4_;
        if (lineEnd <= lineStarts._4_4_) {
          if ((nextLineStart == 0) ||
             ((piVar1[nextLineStart + -1] != lineEnd && (nVis != lineStarts._4_4_)))) {
            piVar1[nextLineStart] = lineEnd;
            nextLineStart = nextLineStart + 1;
          }
          break;
        }
        piVar1[nextLineStart] = lineStarts._4_4_;
      }
      for (; nextLineStart <= bufLen; nextLineStart = nextLineStart + 1) {
        piVar1[nextLineStart] = -1;
      }
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::calc_line_starts( int startLine, int endLine ) {
  int startPos, bufLen = mBuffer->length();
  int line, lineEnd, nextLineStart, nVis = mNVisibleLines;
  int *lineStarts = mLineStarts;

  /* Clean up (possibly) messy input parameters */
  if ( endLine < 0 ) endLine = 0;
  if ( endLine >= nVis ) endLine = nVis - 1;
  if ( startLine < 0 ) startLine = 0;
  if ( startLine >= nVis ) startLine = nVis - 1;
  if ( startLine > endLine )
    return;

  /* Find the last known good line number -> position mapping */
  if ( startLine == 0 ) {
    lineStarts[ 0 ] = mFirstChar;
    startLine = 1;
  }
  startPos = lineStarts[ startLine - 1 ];

  /* If the starting position is already past the end of the text,
   fill in -1's (means no text on line) and return */
  if ( startPos == -1 ) {
    for ( line = startLine; line <= endLine; line++ )
      lineStarts[ line ] = -1;
    return;
  }

  /* Loop searching for ends of lines and storing the positions of the
   start of the next line in lineStarts */
  for ( line = startLine; line <= endLine; line++ ) {
    find_line_end(startPos, true, &lineEnd, &nextLineStart);
    startPos = nextLineStart;
    if ( startPos >= bufLen ) {
      /* If the buffer ends with a newline or line break, put
       buf->length() in the next line start position (instead of
       a -1 which is the normal marker for an empty line) to
       indicate that the cursor may safely be displayed there */
      if ( line == 0 || ( lineStarts[ line - 1 ] != bufLen &&
                         lineEnd != nextLineStart ) ) {
        lineStarts[ line ] = bufLen;
        line++;
      }
      break;
    }
    lineStarts[ line ] = startPos;
  }

  /* Set any entries beyond the end of the text to -1 */
  for ( ; line <= endLine; line++ )
    lineStarts[ line ] = -1;
}